

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O3

int header_bin_le(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,
                 size_t *name_pad)

{
  byte bVar1;
  void *pvVar2;
  int iVar3;
  ulong s;
  
  (a->archive).archive_format = 0x10002;
  (a->archive).archive_format_name = "cpio (little-endian binary)";
  iVar3 = 0;
  pvVar2 = __archive_read_ahead(a,0x1a,(ssize_t *)0x0);
  if (pvVar2 == (void *)0x0) {
    iVar3 = -0x1e;
  }
  else {
    archive_entry_set_dev(entry,(ulong)*(ushort *)((long)pvVar2 + 2));
    archive_entry_set_ino(entry,(ulong)*(ushort *)((long)pvVar2 + 4));
    archive_entry_set_mode(entry,(uint)*(ushort *)((long)pvVar2 + 6));
    archive_entry_set_uid(entry,(ulong)*(ushort *)((long)pvVar2 + 8));
    archive_entry_set_gid(entry,(ulong)*(ushort *)((long)pvVar2 + 10));
    archive_entry_set_nlink(entry,(uint)*(ushort *)((long)pvVar2 + 0xc));
    archive_entry_set_rdev(entry,(ulong)*(ushort *)((long)pvVar2 + 0xe));
    archive_entry_set_mtime
              (entry,(ulong)*(byte *)((long)pvVar2 + 0x13) << 8 |
                     (long)(int)((uint)*(ushort *)((long)pvVar2 + 0x10) << 0x10) |
                     (ulong)*(byte *)((long)pvVar2 + 0x12),0);
    bVar1 = *(byte *)((long)pvVar2 + 0x14);
    *namelength = (ulong)*(ushort *)((long)pvVar2 + 0x14);
    *name_pad = (ulong)(bVar1 & 1);
    s = (ulong)*(byte *)((long)pvVar2 + 0x19) << 8 |
        (long)(int)((uint)*(ushort *)((long)pvVar2 + 0x16) << 0x10) |
        (ulong)*(byte *)((long)pvVar2 + 0x18);
    cpio->entry_bytes_remaining = s;
    archive_entry_set_size(entry,s);
    cpio->entry_padding = (ulong)((uint)cpio->entry_bytes_remaining & 1);
    __archive_read_consume(a,0x1a);
  }
  return iVar3;
}

Assistant:

static int
header_bin_le(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	const unsigned char *header;

	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_BIN_LE;
	a->archive.archive_format_name = "cpio (little-endian binary)";

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, bin_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out binary fields. */
	header = (const unsigned char *)h;

	archive_entry_set_dev(entry, header[bin_dev_offset] + header[bin_dev_offset + 1] * 256);
	archive_entry_set_ino(entry, header[bin_ino_offset] + header[bin_ino_offset + 1] * 256);
	archive_entry_set_mode(entry, header[bin_mode_offset] + header[bin_mode_offset + 1] * 256);
	archive_entry_set_uid(entry, header[bin_uid_offset] + header[bin_uid_offset + 1] * 256);
	archive_entry_set_gid(entry, header[bin_gid_offset] + header[bin_gid_offset + 1] * 256);
	archive_entry_set_nlink(entry, header[bin_nlink_offset] + header[bin_nlink_offset + 1] * 256);
	archive_entry_set_rdev(entry, header[bin_rdev_offset] + header[bin_rdev_offset + 1] * 256);
	archive_entry_set_mtime(entry, le4(header + bin_mtime_offset), 0);
	*namelength = header[bin_namesize_offset] + header[bin_namesize_offset + 1] * 256;
	*name_pad = *namelength & 1; /* Pad to even. */

	cpio->entry_bytes_remaining = le4(header + bin_filesize_offset);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	cpio->entry_padding = cpio->entry_bytes_remaining & 1; /* Pad to even. */
	__archive_read_consume(a, bin_header_size);
	return (ARCHIVE_OK);
}